

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

string * __thiscall
bsim::quad_value_bit_vector::binary_string_abi_cxx11_
          (string *__return_storage_ptr__,quad_value_bit_vector *this)

{
  ulong uVar1;
  quad_value local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_48);
  for (uVar1 = (ulong)(uint)this->N; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
    local_49.value =
         (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar1 - 1].value;
    quad_value::binary_string_abi_cxx11_(&local_48,&local_49);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string binary_string() const {
      std::string str = "";
      const int N = bitLength();
      for (int i = N - 1; i >= 0; i--) {
        str += get(i).binary_string();
      }

      return str;
    }